

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

bool ONX_Model::GetRDKEmbeddedFilePaths(ONX_Model_UserData *docud,ON_ClassArray<ON_wString> *paths)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ON_Read3dmBufferArchive archive;
  ON_wString local_278;
  ON_Read3dmBufferArchive local_270;
  
  bVar1 = ::IsRDKDocumentInformation(docud);
  if (bVar1) {
    ON_Read3dmBufferArchive::ON_Read3dmBufferArchive
              (&local_270,(long)(docud->m_goo).m_value,(docud->m_goo).m_goo,false,
               docud->m_usertable_3dm_version,docud->m_usertable_opennurbs_version);
    iVar3 = SeekArchiveToEmbeddedFiles(&local_270,(docud->m_goo).m_value);
    if (iVar3 == 0) {
LAB_0046e638:
      bVar1 = false;
    }
    else {
      bVar1 = 0 < iVar3;
      if (0 < iVar3) {
        iVar4 = 1;
        do {
          ON_wString::ON_wString(&local_278);
          bVar2 = ON_BinaryArchive::ReadString(&local_270.super_ON_BinaryArchive,&local_278);
          if (!bVar2) {
            ON_wString::~ON_wString(&local_278);
LAB_0046e632:
            if (bVar1) goto LAB_0046e638;
            break;
          }
          ON_ClassArray<ON_wString>::Append(paths,&local_278);
          SeekArchivePastCompressedBuffer(&local_270.super_ON_BinaryArchive);
          ON_wString::~ON_wString(&local_278);
          if (!bVar2) goto LAB_0046e632;
          bVar1 = iVar4 < iVar3;
          bVar2 = iVar4 != iVar3;
          iVar4 = iVar4 + 1;
        } while (bVar2);
      }
      bVar1 = 0 < paths->m_count;
    }
    ON_Read3dmBufferArchive::~ON_Read3dmBufferArchive(&local_270);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ONX_Model::GetRDKEmbeddedFilePaths(const ONX_Model_UserData& docud, ON_ClassArray<ON_wString>& paths)
{
  if (!::IsRDKDocumentInformation(docud))
    return false;

  ON_Read3dmBufferArchive archive(docud.m_goo.m_value, docud.m_goo.m_goo, false, docud.m_usertable_3dm_version, docud.m_usertable_opennurbs_version);

  const int count = SeekArchiveToEmbeddedFiles(archive, docud.m_goo.m_value);
  if (!ReadEmbeddedFilePathsFromArchive(archive, count, paths))
    return false;

  return true;
}